

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O1

Distortion * gmath::Distortion::create(Properties *prop,int id)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined4 extraout_EAX;
  int iVar3;
  undefined4 extraout_EAX_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  RadialDistortion *this;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  int in_ECX;
  void *__child_stack;
  void *__child_stack_00;
  void *__child_stack_01;
  void *__child_stack_02;
  Properties *pPVar4;
  void *in_R8;
  RadialTangentialDistortion rtd;
  RationalTangentialDistortion ratd;
  EquidistantDistortion ed;
  RationalTangentialThinPrismDistortion ratpd;
  RadialTangentialDistortion RStack_128;
  RationalTangentialDistortion local_f0;
  EquidistantDistortion local_a8;
  RationalTangentialThinPrismDistortion local_80;
  
  pPVar4 = prop;
  EquidistantDistortion::EquidistantDistortion(&local_a8,prop,id);
  auVar1._4_4_ = -(uint)(local_a8.ed[1] != 0.0);
  auVar1._0_4_ = -(uint)(local_a8.ed[0] != 0.0);
  auVar1._8_4_ = -(uint)(local_a8.ed[2] != 0.0);
  auVar1._12_4_ = -(uint)(local_a8.ed[3] != 0.0);
  iVar3 = movmskps(extraout_EAX,auVar1);
  if (iVar3 == 0) {
    pPVar4 = prop;
    RationalTangentialThinPrismDistortion::RationalTangentialThinPrismDistortion(&local_80,prop,id);
    auVar2._4_4_ = -(uint)(local_80.kd[9] != 0.0);
    auVar2._0_4_ = -(uint)(local_80.kd[8] != 0.0);
    auVar2._8_4_ = -(uint)(local_80.kd[10] != 0.0);
    auVar2._12_4_ = -(uint)(local_80.kd[0xb] != 0.0);
    iVar3 = movmskps(extraout_EAX_00,auVar2);
    if (iVar3 == 0) {
      pPVar4 = prop;
      RationalTangentialDistortion::RationalTangentialDistortion(&local_f0,prop,id);
      if (((((local_f0.kd[5] != 0.0) || (NAN(local_f0.kd[5]))) || (local_f0.kd[6] != 0.0)) ||
          ((NAN(local_f0.kd[6]) || (local_f0.kd[7] != 0.0)))) || (NAN(local_f0.kd[7]))) {
        iVar3 = RationalTangentialDistortion::clone
                          (&local_f0,(__fn *)pPVar4,__child_stack_01,in_ECX,in_R8);
        this = (RadialDistortion *)CONCAT44(extraout_var_01,iVar3);
      }
      else {
        pPVar4 = prop;
        RadialTangentialDistortion::RadialTangentialDistortion(&RStack_128,prop,id);
        if (((RStack_128.kd[0] != 0.0) || (NAN(RStack_128.kd[0]))) ||
           ((RStack_128.kd[1] != 0.0 || (NAN(RStack_128.kd[1]))))) {
          iVar3 = RadialTangentialDistortion::clone
                            (&RStack_128,(__fn *)pPVar4,__child_stack_02,in_ECX,in_R8);
          this = (RadialDistortion *)CONCAT44(extraout_var_02,iVar3);
        }
        else if (RStack_128.kn < 1) {
          this = (RadialDistortion *)0x0;
        }
        else {
          this = (RadialDistortion *)operator_new(0x28);
          RadialDistortion::RadialDistortion(this,prop,id);
        }
      }
    }
    else {
      iVar3 = RationalTangentialThinPrismDistortion::clone
                        (&local_80,(__fn *)pPVar4,__child_stack_00,in_ECX,in_R8);
      this = (RadialDistortion *)CONCAT44(extraout_var_00,iVar3);
    }
  }
  else {
    iVar3 = EquidistantDistortion::clone(&local_a8,(__fn *)pPVar4,__child_stack,in_ECX,in_R8);
    this = (RadialDistortion *)CONCAT44(extraout_var,iVar3);
  }
  return &this->super_Distortion;
}

Assistant:

Distortion *Distortion::create(const gutil::Properties &prop, int id)
{
  // try equidistant model

  EquidistantDistortion ed(prop, id);

  if (ed.getParameter(0) != 0 || ed.getParameter(1) != 0 ||
      ed.getParameter(2) != 0 || ed.getParameter(3) != 0)
  {
    return ed.clone();
  }

  // create best fitting model, i.e. with lowest number of parameters

  RationalTangentialThinPrismDistortion ratpd(prop, id);

  if (ratpd.getParameter(8) != 0 || ratpd.getParameter(9) != 0 || ratpd.getParameter(10) != 0 ||
      ratpd.getParameter(11) != 0)
  {
    return ratpd.clone();
  }

  RationalTangentialDistortion ratd(prop, id);

  if (ratd.getParameter(5) != 0 || ratd.getParameter(6) != 0 || ratd.getParameter(7) != 0)
  {
    return ratd.clone();
  }

  RadialTangentialDistortion rtd(prop, id);

  if (rtd.getParameter(0) != 0 || rtd.getParameter(1) != 0)
  {
    return rtd.clone();
  }

  if (rtd.countParameter() > 2 || rtd.getParameter(0) != 0 || rtd.getParameter(1) != 0)
  {
    return new RadialDistortion(prop, id);
  }

  return 0;
}